

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

void flattenDatabase(Database *database,Rules *rules)

{
  bool verbose;
  __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_> __tmp;
  pointer interval;
  vector<Interval,_std::allocator<Interval>_> expanded;
  Interval latest;
  allocator<char> local_119;
  vector<Interval,_std::allocator<Interval>_> local_118;
  string local_100;
  Interval local_e0;
  
  getLatestInterval(&local_e0,database);
  expandLatest(&local_118,&local_e0,rules);
  if (1 < (ulong)(((long)local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0xc0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"verbose",&local_119);
    verbose = Rules::getBoolean(rules,&local_100,false);
    std::__cxx11::string::~string((string *)&local_100);
    Database::deleteInterval(database,&local_e0);
    interval = local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_finish;
    while (interval !=
           local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_start) {
      interval[-1].synthetic = false;
      interval = interval + -1;
      Database::addInterval(database,interval,verbose);
    }
  }
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_118);
  Interval::~Interval(&local_e0);
  return;
}

Assistant:

void flattenDatabase (Database& database, const Rules& rules)
{
  Interval latest = getLatestInterval (database);
  std::vector <Interval> expanded = expandLatest (latest, rules);

  if (expanded.size () > 1)
  {
    bool verbose = rules.getBoolean ("verbose");
    database.deleteInterval (latest);
    for (auto it = expanded.rbegin (); it != expanded.rend (); ++it)
    {
      it->synthetic = false;
      database.addInterval (*it, verbose);
    }
  }
}